

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::PtexTextureBase::BaseToString_abi_cxx11_(string *__return_storage_ptr__,PtexTextureBase *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<bool_const&,std::__cxx11::string_const&,pbrt::ColorEncodingHandle_const&>
            (__return_storage_ptr__,"valid: %s filename: %s encoding: %s",&this->valid,
             &this->filename,&this->encoding);
  return __return_storage_ptr__;
}

Assistant:

std::string PtexTextureBase::BaseToString() const {
    return StringPrintf("valid: %s filename: %s encoding: %s", valid, filename, encoding);
}